

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemon.c
# Opt level: O1

monst * clone_mon(monst *mon,xchar x,xchar y)

{
  xchar x_00;
  xchar y_00;
  byte bVar1;
  uint uVar2;
  permonst *ppVar3;
  level *plVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  uint uVar8;
  boolean bVar9;
  int iVar10;
  uint uVar11;
  undefined8 in_RAX;
  monst *mon_00;
  char *pcVar12;
  monst *pmVar13;
  monst *mtmp2;
  long lVar14;
  int iVar15;
  schar sVar16;
  monst *pmVar17;
  size_t __size;
  schar sVar18;
  byte bVar19;
  coord mm;
  undefined8 uStack_38;
  
  bVar19 = 0;
  if (mon->mhp < 2) {
    return (monst *)0x0;
  }
  uStack_38 = in_RAX;
  iVar10 = monsndx(mon->data);
  if ((mvitals[iVar10].mvflags & 1) != 0) {
    return (monst *)0x0;
  }
  if (x == '\0') {
    uStack_38._0_7_ = CONCAT16(mon->mx,(undefined6)uStack_38);
    uStack_38 = CONCAT17(mon->my,(undefined7)uStack_38);
    bVar9 = enexto((coord *)((long)&uStack_38 + 6),level,mon->mx,mon->my,mon->data);
    if (bVar9 == '\0') {
      return (monst *)0x0;
    }
    pcVar12 = level->levname + (long)uStack_38._6_1_ * 0xa8;
LAB_001baae8:
    if ((*(long *)(pcVar12 + (long)uStack_38._7_1_ * 8 + 0x8380) != 0) &&
       ((*(byte *)(*(long *)(pcVar12 + (long)uStack_38._7_1_ * 8 + 0x8380) + 0x61) & 2) == 0)) {
      return (monst *)0x0;
    }
  }
  else {
    if (0x14 < (byte)y || 0x4f < (byte)x) {
      return (monst *)0x0;
    }
    uStack_38._0_7_ = CONCAT16(x,(undefined6)uStack_38);
    uStack_38 = CONCAT17(y,(undefined7)uStack_38);
    pmVar13 = level->monsters[(byte)x][(byte)y];
    if ((pmVar13 != (monst *)0x0) && ((pmVar13->field_0x61 & 2) == 0)) {
      bVar9 = enexto((coord *)((long)&uStack_38 + 6),level,x,y,mon->data);
      if (bVar9 == '\0') {
        return (monst *)0x0;
      }
      pcVar12 = level->levname + (long)uStack_38._6_1_ * 0xa8;
      goto LAB_001baae8;
    }
  }
  mon_00 = (monst *)malloc(0x78);
  pmVar13 = mon;
  pmVar17 = mon_00;
  for (lVar14 = 0xf; plVar4 = level, lVar14 != 0; lVar14 = lVar14 + -1) {
    pmVar17->nmon = pmVar13->nmon;
    pmVar13 = (monst *)((long)pmVar13 + (ulong)bVar19 * -0x10 + 8);
    pmVar17 = (monst *)((long)pmVar17 + (ulong)bVar19 * -0x10 + 8);
  }
  mon_00->nmon = level->monlist;
  plVar4->monlist = mon_00;
  uVar2 = flags.ident;
  uVar11 = flags.ident + 1;
  uVar8 = uVar11;
  mon_00->m_id = flags.ident;
  flags.ident = uVar8;
  if (uVar2 == 0) {
    flags.ident = 2;
    mon_00->m_id = uVar11;
  }
  mon_00->mx = uStack_38._6_1_;
  mon_00->my = uStack_38._7_1_;
  mon_00->minvent = (obj *)0x0;
  uVar11 = *(uint *)&mon_00->field_0x60;
  *(uint *)&mon_00->field_0x60 = uVar11 & 0xfeffffff;
  mon_00->mhpmax = mon->mhpmax;
  iVar10 = mon->mhp;
  iVar15 = iVar10 / 2;
  mon_00->mhp = iVar15;
  mon->mhp = iVar10 - iVar15;
  uVar2 = *(uint *)&mon->field_0x60;
  if ((uVar2 >> 0x19 & 1) != 0) {
    *(uint *)&mon_00->field_0x60 = uVar11 & 0xfcffffff;
  }
  if ((uVar2 >> 0x1b & 1) != 0) {
    mon_00->field_0x63 = mon_00->field_0x63 & 0xf7;
  }
  if ((uVar2 >> 0x1c & 1) != 0) {
    mon_00->field_0x63 = mon_00->field_0x63 & 0xef;
  }
  mon_00->mxlth = 0;
  place_monster(mon_00,(int)mon_00->mx,(int)mon_00->my);
  ppVar3 = mon_00->data;
  if ((ppVar3 == mons + 0x101 || (ppVar3 == mons + 0x21 || ppVar3 == mons + 0x20)) ||
      ppVar3->mlet == '\x19') {
LAB_001bac9e:
    ppVar3 = mon_00->data;
    plVar4 = mon_00->dlevel;
    x_00 = mon_00->mx;
    y_00 = mon_00->my;
    uVar11 = 1;
    if ((ppVar3 != mons + 0x101 && (ppVar3 != mons + 0x21 && ppVar3 != mons + 0x20)) &&
        ppVar3->mlet != '\x19') {
      pcVar12 = mons_mname(ppVar3);
      iVar10 = strcmp(pcVar12,"gold dragon");
      if (iVar10 != 0) {
        pcVar12 = mons_mname(mon_00->data);
        iVar10 = strcmp(pcVar12,"baby gold dragon");
        if ((iVar10 != 0) && (mon_00->data != mons + 0x73)) {
          uVar11 = (uint)(mon_00->data == mons + 0xa0);
        }
      }
    }
    new_light_source(plVar4,x_00,y_00,uVar11,1,mon_00);
  }
  else {
    pcVar12 = mons_mname(ppVar3);
    iVar10 = strcmp(pcVar12,"gold dragon");
    if (iVar10 == 0) goto LAB_001bac9e;
    pcVar12 = mons_mname(mon_00->data);
    iVar10 = strcmp(pcVar12,"baby gold dragon");
    if ((iVar10 == 0) || (mon_00->data == mons + 0xa0 || mon_00->data == mons + 0x73))
    goto LAB_001bac9e;
  }
  if (mon_00->mnamelth == '\0') {
    if ((mon->field_0x63 & 2) == 0) goto LAB_001badad;
    pcVar12 = shkname(mon);
  }
  else {
    mon_00->mnamelth = '\0';
    pcVar12 = (char *)((long)(mon->mtrack + 0x18) + (long)mon->mxlth);
  }
  mon_00 = christen_monst(mon_00,pcVar12);
LAB_001badad:
  if (flags.mon_moving == '\0') {
    if (mon->mtame == '\0') {
      if ((mon->field_0x62 & 0x40) != 0) {
        sVar16 = u.uluck;
        if (u.uluck < '\x01') {
          sVar16 = '\0';
        }
        uVar11 = mt_random();
        *(uint *)&mon_00->field_0x60 =
             *(uint *)&mon_00->field_0x60 & 0xffbfffff |
             (uint)(uVar11 % (uint)(byte)(sVar16 + 2) != 0) << 0x16;
      }
    }
    else {
      sVar16 = '\0';
      sVar18 = u.uluck;
      if (u.uluck < '\x01') {
        sVar18 = '\0';
      }
      uVar11 = mt_random();
      if (uVar11 % (uint)(byte)(sVar18 + 2) != 0) {
        sVar16 = mon->mtame;
      }
      mon_00->mtame = sVar16;
    }
  }
  newsym((int)mon_00->mx,(int)mon_00->my);
  if (mon_00->mtame != '\0') {
    if ((mon->field_0x63 & 4) == 0) {
      mon_00->mtame = '\0';
      pmVar13 = tamedog(mon_00,(obj *)0x0);
      if (pmVar13 != (monst *)0x0) {
        *(undefined4 *)((long)&pmVar13[1].minvent + 4) = *(undefined4 *)((long)&mon[1].minvent + 4);
        uVar5 = *(undefined8 *)&mon->field_0x74;
        uVar6 = *(undefined8 *)((long)&mon[1].nmon + 4);
        uVar7 = *(undefined8 *)((long)&mon[1].dlevel + 4);
        *(undefined8 *)((long)&pmVar13[1].data + 4) = *(undefined8 *)((long)&mon[1].data + 4);
        *(undefined8 *)((long)&pmVar13[1].dlevel + 4) = uVar7;
        *(undefined8 *)&pmVar13->field_0x74 = uVar5;
        *(undefined8 *)((long)&pmVar13[1].nmon + 4) = uVar6;
        mon_00 = pmVar13;
      }
    }
    else {
      bVar1 = mon->mnamelth;
      __size = (ulong)bVar1 + 0x7e;
      mtmp2 = (monst *)malloc(__size);
      memset(mtmp2,0,__size);
      mtmp2->mxtyp = '\x01';
      mtmp2->mxlth = 6;
      mtmp2->mnamelth = bVar1;
      pmVar13 = mon_00;
      pmVar17 = mtmp2;
      for (lVar14 = 0xf; lVar14 != 0; lVar14 = lVar14 + -1) {
        pmVar17->nmon = pmVar13->nmon;
        pmVar13 = (monst *)((long)pmVar13 + (ulong)bVar19 * -0x10 + 8);
        pmVar17 = (monst *)((long)pmVar17 + (ulong)bVar19 * -0x10 + 8);
      }
      mtmp2->mxtyp = '\x01';
      mtmp2->mxlth = 6;
      if (mon_00->mnamelth != '\0') {
        strcpy((char *)((long)&mtmp2[1].nmon + 2),
               (char *)((long)(mon_00->mtrack + 0x18) + (long)mon_00->mxlth));
      }
      *(undefined2 *)&mtmp2[1].nmon = *(undefined2 *)&mon[1].nmon;
      *(undefined4 *)&mtmp2->field_0x74 = *(undefined4 *)&mon->field_0x74;
      replmon(mon_00,mtmp2);
      mon_00 = mtmp2;
    }
  }
  set_malign(mon_00);
  return mon_00;
}

Assistant:

struct monst *clone_mon(struct monst *mon,
			xchar x, xchar y)/* clone's preferred location or 0 (near mon) */
{
	coord mm;
	struct monst *m2;

	/* may be too weak or have been extinguished for population control */
	if (mon->mhp <= 1 || (mvitals[monsndx(mon->data)].mvflags & G_EXTINCT))
	    return NULL;

	if (x == 0) {
	    mm.x = mon->mx;
	    mm.y = mon->my;
	    if (!enexto(&mm, level, mm.x, mm.y, mon->data) || MON_AT(level, mm.x, mm.y))
		return NULL;
	} else if (!isok(x, y)) {
	    return NULL;	/* paranoia */
	} else {
	    mm.x = x;
	    mm.y = y;
	    if (MON_AT(level, mm.x, mm.y)) {
		if (!enexto(&mm, level, mm.x, mm.y, mon->data) || MON_AT(level, mm.x, mm.y))
		    return NULL;
	    }
	}
	m2 = newmonst(MX_NONE, 0);
	*m2 = *mon;			/* copy condition of old monster */
	m2->nmon = level->monlist;
	level->monlist = m2;
	m2->m_id = flags.ident++;
	if (!m2->m_id) m2->m_id = flags.ident++;	/* ident overflowed */
	m2->mx = mm.x;
	m2->my = mm.y;

	m2->minvent = NULL; /* objects don't clone */
	m2->mleashed = FALSE;
	/* Max HP the same, but current HP halved for both.  The caller
	 * might want to override this by halving the max HP also.
	 * When current HP is odd, the original keeps the extra point.
	 */
	m2->mhpmax = mon->mhpmax;
	m2->mhp = mon->mhp / 2;
	mon->mhp -= m2->mhp;

	/* since shopkeepers and guards will only be cloned if they've been
	 * polymorphed away from their original forms, the clone doesn't have
	 * room for the extra information.  we also don't want two shopkeepers
	 * around for the same shop.
	 */
	if (mon->isshk) m2->isshk = FALSE;
	if (mon->isgd) m2->isgd = FALSE;
	if (mon->ispriest) m2->ispriest = FALSE;
	m2->mxlth = 0;
	place_monster(m2, m2->mx, m2->my);
	if (emits_light(m2->data))
	    new_light_source(m2->dlevel, m2->mx, m2->my, emits_light(m2->data),
			     LS_MONSTER, m2);
	if (m2->mnamelth) {
	    m2->mnamelth = 0; /* or it won't get allocated */
	    m2 = christen_monst(m2, NAME(mon));
	} else if (mon->isshk) {
	    m2 = christen_monst(m2, shkname(mon));
	}

	/* not all clones caused by player are tame or peaceful */
	if (!flags.mon_moving) {
	    if (mon->mtame)
		m2->mtame = rn2(max(2 + u.uluck, 2)) ? mon->mtame : 0;
	    else if (mon->mpeaceful)
		m2->mpeaceful = rn2(max(2 + u.uluck, 2)) ? 1 : 0;
	}

	newsym(m2->mx,m2->my);	/* display the new monster */
	if (m2->mtame) {
	    struct monst *m3;

	    if (mon->isminion) {
		m3 = newmonst(MX_EPRI, mon->mnamelth);
		*m3 = *m2;
		m3->mxtyp = MX_EPRI;
		m3->mxlth = sizeof(struct epri);
		if (m2->mnamelth) strcpy(NAME(m3), NAME(m2));
		*(EPRI(m3)) = *(EPRI(mon));
		replmon(m2, m3);
		m2 = m3;
	    } else {
		/* because m2 is a copy of mon it is tame but not init'ed.
		 * however, tamedog will not re-tame a tame dog, so m2
		 * must be made non-tame to get initialized properly.
		 */
		m2->mtame = 0;
		if ((m3 = tamedog(m2, NULL)) != 0) {
		    m2 = m3;
		    *(EDOG(m2)) = *(EDOG(mon));
		}
	    }
	}
	set_malign(m2);

	return m2;
}